

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O1

int Wln_ObjAddFanins(Wln_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  long lVar1;
  
  if (0 < vFanins->nSize) {
    lVar1 = 0;
    do {
      Wln_ObjAddFanin(p,iObj,vFanins->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vFanins->nSize);
  }
  return iObj;
}

Assistant:

int Wln_ObjAddFanins( Wln_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    Vec_IntForEachEntry( vFanins, iFanin, i )
        Wln_ObjAddFanin( p, iObj, iFanin );
    return iObj;
}